

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void ModulusHelper<short,_unsigned_long,_4>::
     ModulusThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (short *t,unsigned_long *u,short *result)

{
  uint32_t uVar1;
  short sVar2;
  
  if (*u != 0) {
    sVar2 = *t;
    if ((long)sVar2 < 0) {
      uVar1 = AbsValueHelper<short,_0>::Abs(sVar2);
      sVar2 = -(short)((ulong)uVar1 % *u);
    }
    else {
      sVar2 = (short)((ulong)(long)sVar2 % *u);
    }
    *result = sVar2;
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //t could be negative - if so, need to convert to positive
        if(t < 0)
            result = (T)( ~( AbsValueHelper< T, GetAbsMethod< T >::method >::Abs( t ) % u ) + 1);
        else
            result = (T)( (T)t % u );
    }